

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd.c
# Opt level: O0

int strlen16(unsigned_short *s)

{
  int local_14;
  unsigned_short *puStack_10;
  int len;
  unsigned_short *s_local;
  
  local_14 = 0;
  for (puStack_10 = s; *puStack_10 != 0; puStack_10 = puStack_10 + 1) {
    local_14 = local_14 + 1;
  }
  return local_14;
}

Assistant:

static int
strlen16 (unsigned short *s)
{
	int len = 0;
	while (*s) {
		s++;
		len++;
	}
	return len;
}